

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool CoreML::Specification::NeuralNetworkMultiArrayShapeMapping_Parse
               (ConstStringParam name,NeuralNetworkMultiArrayShapeMapping *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  NeuralNetworkMultiArrayShapeMapping local_1c;
  bool success;
  NeuralNetworkMultiArrayShapeMapping *pNStack_18;
  int int_value;
  NeuralNetworkMultiArrayShapeMapping *value_local;
  ConstStringParam name_local;
  
  pNStack_18 = value;
  value_local = (NeuralNetworkMultiArrayShapeMapping *)name;
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_30,name);
  name_00.length_ = (size_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)NeuralNetworkMultiArrayShapeMapping_entries,(EnumEntry *)0x2,
                     (size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pNStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool NeuralNetworkMultiArrayShapeMapping_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, NeuralNetworkMultiArrayShapeMapping* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      NeuralNetworkMultiArrayShapeMapping_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<NeuralNetworkMultiArrayShapeMapping>(int_value);
  }
  return success;
}